

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_copy.cpp
# Opt level: O1

bool Image2Trinity(string *path,string *param_2)

{
  pointer *ppbVar1;
  pointer puVar2;
  element_type *peVar3;
  undefined1 uVar4;
  bool bVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  int len;
  int iVar9;
  Data *pDVar10;
  exception *peVar11;
  ulong uVar12;
  long lVar13;
  pointer puVar14;
  uint8_t *puVar15;
  uint8_t *puVar16;
  bool bVar17;
  Sector *s;
  unique_ptr<Trinity,_std::default_delete<Trinity>_> trinity;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  devices;
  shared_ptr<Disk> disk;
  string name;
  byte local_da;
  undefined1 local_d9;
  uint8_t *local_d8;
  Sector *local_d0;
  _Head_base<0UL,_Trinity_*,_false> local_c8;
  int local_bc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  shared_ptr<Disk> local_98;
  char *local_88;
  undefined8 local_80;
  char local_78;
  undefined7 uStack_77;
  ulong local_68;
  long *local_60 [2];
  long local_50 [2];
  pointer local_40;
  char *local_38;
  
  local_98.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (Disk *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<Disk,std::allocator<Disk>>
            (&local_98.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (Disk **)&local_98,(allocator<Disk> *)&local_88);
  local_d0 = (Sector *)0x0;
  local_88 = &local_78;
  local_80 = 0;
  local_78 = '\0';
  uVar4 = ReadImage(path,&local_98,true);
  if ((bool)uVar4) {
    ppbVar1 = &local_b8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    puVar15 = (uint8_t *)0x1;
    uVar12 = 1;
    puVar14 = (pointer)0x0;
    local_d9 = uVar4;
    while( true ) {
      peVar3 = local_98.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_d8 = (uint8_t *)CONCAT71(local_d8._1_7_,(char)uVar12);
      Header::Header((Header *)&local_b8,0,0,(int)puVar15,2);
      bVar5 = Disk::find(peVar3,(Header *)&local_b8,&local_d0);
      if (!bVar5) break;
      puVar16 = puVar15;
      if (puVar14 == (pointer)0x0) {
        lVar13 = -0x100;
        local_d8 = puVar15;
        do {
          pDVar10 = Sector::data_copy(local_d0,0);
          puVar2 = (pDVar10->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_b8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)ppbVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b8,puVar2 + lVar13 + 0x101,puVar2 + lVar13 + 0x10b);
          std::__cxx11::string::operator=((string *)&local_88,(string *)&local_b8);
          if (local_b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)ppbVar1) {
            operator_delete(local_b8.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)&((local_b8.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                                           _M_dataplus)._M_p + 1));
          }
          bVar5 = true;
          if (((puVar2[lVar13 + 0x100] & 0x3f) == 0x13) && (puVar2[lVar13 + 0x1f2] != 0xff)) {
            std::__cxx11::string::substr((ulong)local_60,(ulong)&local_88);
            iVar7 = strcasecmp((char *)local_60[0],"auto");
            bVar5 = iVar7 != 0;
            bVar17 = true;
          }
          else {
            bVar17 = false;
          }
          if ((bVar17) && (local_60[0] != local_50)) {
            operator_delete(local_60[0],local_50[0] + 1);
          }
          bVar17 = lVar13 == -0x100;
          lVar13 = lVar13 + 0x100;
        } while ((bool)(bVar5 & bVar17));
        puVar14 = (pointer)0x0;
        puVar16 = local_d8;
        if (!bVar5) {
          puVar14 = puVar2 + lVar13;
        }
      }
      uVar12 = (ulong)(puVar14 == (pointer)0x0);
      if ((puVar14 != (pointer)0x0) ||
         (puVar15 = (uint8_t *)(ulong)((uint)puVar16 + 1), 9 < (uint)puVar16)) goto LAB_00145696;
    }
    uVar12 = (ulong)local_d8 & 0xff;
LAB_00145696:
    if ((uVar12 & 1) != 0) {
      peVar11 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[38]>
                (peVar11,(char (*) [38])"no suitable auto-executing code found");
      __cxa_throw(peVar11,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
    uVar8 = TPeek(puVar14 + 0xec,0x4000);
    iVar7 = TPeek(puVar14 + 0xf2,0);
    len = TPeek(puVar14 + 0xef,0);
    if (0x5fff < (int)(len + uVar8) && (int)uVar8 < 0x8000) {
      peVar11 = (exception *)__cxa_allocate_exception(0x10);
      util::exception::exception<char_const(&)[47]>
                (peVar11,(char (*) [47])"code overlaps 6000-7fff range used by TrinLoad");
      __cxa_throw(peVar11,&util::exception::typeinfo,std::runtime_error::~runtime_error);
    }
    local_bc = iVar7;
    local_68 = (ulong)uVar8;
    puVar15 = AllocMem(len);
    bVar6 = puVar14[0xd];
    local_da = puVar14[0xe];
    if (0 < len) {
      iVar7 = 0;
      uVar8 = 9;
      local_d8 = puVar15;
      do {
        peVar3 = local_98.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        Header::Header((Header *)&local_b8,(uint)(bVar6 & 0x7f),(uint)(bVar6 >> 7),(uint)local_da,2)
        ;
        bVar5 = Disk::find(peVar3,(Header *)&local_b8,&local_d0);
        if ((!bVar5) || (iVar9 = Sector::data_size(local_d0), puVar15 = local_d8, iVar9 != 0x200)) {
          peVar11 = (exception *)__cxa_allocate_exception(0x10);
          CylHead::CylHead((CylHead *)&local_b8,(uint)(bVar6 & 0x7f),(uint)(bVar6 >> 7));
          util::exception::exception<char_const(&)[21],CylHead,char_const(&)[8],unsigned_char&>
                    (peVar11,(char (*) [21])"end of file reading ",(CylHead *)&local_b8,
                     (char (*) [8])0x1ae15a,&local_da);
          __cxa_throw(peVar11,&util::exception::typeinfo,std::runtime_error::~runtime_error);
        }
        pDVar10 = Sector::data_copy(local_d0,0);
        iVar9 = len - iVar7;
        if ((int)(0x1fe - uVar8) < len - iVar7) {
          iVar9 = 0x1fe - uVar8;
        }
        memcpy(puVar15 + iVar7,
               (pDVar10->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start + uVar8,(long)iVar9);
        iVar7 = iVar9 + iVar7;
        puVar14 = (pDVar10->super_vector<unsigned_char,_std::allocator<unsigned_char>_>).
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        bVar6 = puVar14[0x1fe];
        local_da = puVar14[0x1ff];
        uVar8 = 0;
      } while (iVar7 < len);
    }
    Trinity::Open();
    Trinity::devices_abi_cxx11_(&local_b8,local_c8._M_head_impl);
    iVar7 = local_bc;
    uVar4 = local_d9;
    local_38 = local_88;
    local_40 = *(pointer *)
                local_b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
    Message<char_const*,char_const*>(msgStatus,"Sending %s to %s...",&local_38,(char **)&local_40);
    Trinity::send_file(local_c8._M_head_impl,puVar15,len,(int)local_68,iVar7);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b8);
    std::unique_ptr<Trinity,_std::default_delete<Trinity>_>::~unique_ptr
              ((unique_ptr<Trinity,_std::default_delete<Trinity>_> *)&local_c8);
    FreeMem(puVar15);
  }
  if (local_88 != &local_78) {
    operator_delete(local_88,CONCAT71(uStack_77,local_78) + 1);
  }
  if (local_98.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_98.super___shared_ptr<Disk,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  return (bool)uVar4;
}

Assistant:

bool Image2Trinity(const std::string& path, const std::string&/*trinity_path*/) // ToDo: use trinity_path for record
{
    auto disk = std::make_shared<Disk>();
    const Sector* s = nullptr;
    const MGT_DIR* pdir = nullptr;
    std::string name;

    if (!ReadImage(path, disk))
        return false;

    // Scanning the first 10 directory sectors should be enough
    for (auto sector = 1; !pdir && sector <= MGT_SECTORS; ++sector)
    {
        if (!disk->find(Header(0, 0, sector, 2), s))
            break;

        // Each sector contains 2 MGT directory entries
        for (auto entry = 0; !pdir && entry < 2; ++entry)
        {
            pdir = reinterpret_cast<const MGT_DIR*>(s->data_copy().data() + 256 * entry);

            // Extract the first 4 characters of a potential MGT filename
            name = std::string(reinterpret_cast<const char*>(pdir->abName), 10);

            // Reject if not a code file, or no auto-execute, or not named AUTO*
            if ((pdir->bType & 0x3f) != 19 || pdir->bExecutePage == 0xff ||
                strcasecmp(name.substr(0, 4).c_str(), "auto"))
                pdir = nullptr;
        }
    }

    if (!pdir)
        throw util::exception("no suitable auto-executing code found");

    auto start_addr = TPeek(&pdir->bStartPage, 16384);
    auto exec_addr = TPeek(&pdir->bExecutePage);
    auto file_length = TPeek(&pdir->bLengthInPages);

    // Check the code wouldn't overwrite TrinLoad
    if (start_addr < 0x8000 && (start_addr + file_length) >= 0x6000)
        throw util::exception("code overlaps 6000-7fff range used by TrinLoad");

    auto uPos = 0;
    MEMORY mem(file_length);

    // The file start sector is taken from the directory entry.
    // Code files have a 9-byte metadata header, which must be skipped.
    auto trk = pdir->bStartTrack;
    auto sec = pdir->bStartSector;
    auto uOffset = MGT_FILE_HEADER_SIZE;

    // Loop until we've read the full file
    while (uPos < file_length)
    {
        // Bit 7 of the track number indicates head 1
        uint8_t cyl = (trk & 0x7f);
        uint8_t head = trk >> 7;

        if (!disk->find(Header(cyl, head, sec, 2), s) || s->data_size() != SECTOR_SIZE)
            throw util::exception("end of file reading ", CylHead(cyl, head), " sector", sec);

        // Determine the size of data in this sector, which is at most 510 bytes.
        // The final 2 bytes contain the location of the next sector.
        auto uBlock = std::min(file_length - uPos, 510 - uOffset);
        auto& data = s->data_copy();

        memcpy(mem + uPos, data.data() + uOffset, uBlock);
        uPos += uBlock;
        uOffset = 0;

        // Follow the chain to the next sector
        trk = data[510];
        sec = data[511];
    }

    // Scan the local network for SAM machines running TrinLoad
    auto trinity = Trinity::Open();
    auto devices = trinity->devices();

    // Send the code file to the first device that responded
    Message(msgStatus, "Sending %s to %s...", name.c_str(), devices[0].c_str());
    trinity->send_file(mem, mem.size, start_addr, exec_addr);

    return true;
}